

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fReadPixelsTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ReadPixelsTest::render(ReadPixelsTest *this,Texture2D *reference)

{
  deUint64 __s;
  bool bVar1;
  deBool dVar2;
  deUint32 dVar3;
  GLenum GVar4;
  int iVar5;
  int iVar6;
  RenderContext *renderCtx;
  TestLog *log;
  TestError *this_00;
  PixelBufferAccess *this_01;
  Vector<float,_4> local_284;
  int local_274;
  int local_270;
  int y;
  int x;
  int coordY2;
  int coordX2;
  int coordY1;
  int coordX1;
  GLuint coordLoc;
  float coords [12];
  string local_220;
  allocator<char> local_1e9;
  string local_1e8;
  ProgramSources local_1c8;
  undefined1 local_f8 [8];
  ShaderProgram program;
  char *fragmentSource;
  char *vertexSource;
  Texture2D *reference_local;
  ReadPixelsTest *this_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)anon_var_dwarf_f20f7e;
  renderCtx = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,
             "attribute mediump vec2 a_coord;\nvoid main (void)\n{\n\tgl_Position = vec4(a_coord, 0.0, 1.0);\n}\n"
             ,&local_1e9);
  __s = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,(char *)__s,(allocator<char> *)((long)coords + 0x2f));
  glu::makeVtxFragSources(&local_1c8,&local_1e8,&local_220);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_f8,renderCtx,&local_1c8);
  glu::ProgramSources::~ProgramSources(&local_1c8);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)((long)coords + 0x2f));
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(log,(ShaderProgram *)local_f8);
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 &&
         (bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_f8), bVar1))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      do {
        dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
        glwUseProgram(dVar3);
        GVar4 = glwGetError();
        glu::checkError(GVar4,"glUseProgram(program.getProgram())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                        ,0x61);
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      coords[6] = -0.5;
      coords[7] = 0.5;
      coords[8] = -0.5;
      coords[9] = -0.5;
      coords[2] = 0.5;
      coords[3] = 0.5;
      coords[4] = 0.5;
      coords[5] = 0.5;
      _coordX1 = 0xbf000000bf000000;
      coords[0] = 0.5;
      coords[1] = -0.5;
      dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
      coordY1 = glwGetAttribLocation(dVar3,"a_coord");
      GVar4 = glwGetError();
      glu::checkError(GVar4,"glGetAttribLocation()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                      ,0x72);
      do {
        glwEnableVertexAttribArray(coordY1);
        GVar4 = glwGetError();
        glu::checkError(GVar4,"glEnableVertexAttribArray(coordLoc)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                        ,0x74);
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      do {
        glwVertexAttribPointer(coordY1,2,0x1406,'\0',0,&coordX1);
        GVar4 = glwGetError();
        glu::checkError(GVar4,"glVertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                        ,0x76);
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      do {
        glwDrawArrays(4,0,6);
        GVar4 = glwGetError();
        glu::checkError(GVar4,"glDrawArrays(GL_TRIANGLES, 0, 6)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                        ,0x78);
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      do {
        glwDisableVertexAttribArray(coordY1);
        GVar4 = glwGetError();
        glu::checkError(GVar4,"glDisableVertexAttribArray(coordLoc)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                        ,0x79);
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      iVar5 = tcu::Texture2D::getWidth(reference);
      iVar6 = tcu::Texture2D::getWidth(reference);
      coordX2 = (int)((float)iVar5 * -0.5 * 0.5 + (float)iVar6 * 0.5);
      iVar5 = tcu::Texture2D::getHeight(reference);
      iVar6 = tcu::Texture2D::getHeight(reference);
      coordY2 = (int)((float)iVar5 * -0.5 * 0.5 + (float)iVar6 * 0.5);
      iVar5 = tcu::Texture2D::getWidth(reference);
      iVar6 = tcu::Texture2D::getWidth(reference);
      x = (int)((float)iVar5 * 0.5 * 0.5 + (float)iVar6 * 0.5);
      iVar5 = tcu::Texture2D::getHeight(reference);
      iVar6 = tcu::Texture2D::getHeight(reference);
      y = (int)((float)iVar5 * 0.5 * 0.5 + (float)iVar6 / 2.0);
      for (local_270 = 0; iVar5 = local_270, iVar6 = tcu::Texture2D::getWidth(reference),
          iVar5 < iVar6; local_270 = local_270 + 1) {
        if ((coordX2 <= local_270) && (local_270 <= x)) {
          for (local_274 = 0; iVar5 = local_274, iVar6 = tcu::Texture2D::getHeight(reference),
              iVar5 < iVar6; local_274 = local_274 + 1) {
            if ((coordY2 <= local_274) && (local_274 <= y)) {
              this_01 = tcu::TextureLevelPyramid::getLevel(&reference->super_TextureLevelPyramid,0);
              tcu::Vector<float,_4>::Vector(&local_284,0.0,0.0,0.0,1.0);
              tcu::PixelBufferAccess::setPixel(this_01,&local_284,local_270,local_274,0);
            }
          }
        }
      }
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_f8);
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
             ,0x60);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void ReadPixelsTest::render (tcu::Texture2D& reference)
{
	// Create program
	const char* vertexSource =
	"attribute mediump vec2 a_coord;\n"
	"void main (void)\n"
	"{\n"
	"\tgl_Position = vec4(a_coord, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentSource =
	"void main (void)\n"
	"{\n"
	"\tgl_FragColor = vec4(0.0, 0.0, 0.0, 1.0);\n"
	"}\n";

	glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(vertexSource, fragmentSource));

	m_testCtx.getLog() << program;
	TCU_CHECK(program.isOk());
	GLU_CHECK_CALL(glUseProgram(program.getProgram()));

	// Render
	{
		const float coords[] =
		{
			-0.5f, -0.5f,
			 0.5f, -0.5f,
			 0.5f,  0.5f,

			 0.5f,  0.5f,
			-0.5f,  0.5f,
			-0.5f, -0.5f
		};
		GLuint coordLoc;

		coordLoc = glGetAttribLocation(program.getProgram(), "a_coord");
		GLU_CHECK_MSG("glGetAttribLocation()");

		GLU_CHECK_CALL(glEnableVertexAttribArray(coordLoc));

		GLU_CHECK_CALL(glVertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, coords));

		GLU_CHECK_CALL(glDrawArrays(GL_TRIANGLES, 0, 6));
		GLU_CHECK_CALL(glDisableVertexAttribArray(coordLoc));
	}

	// Render reference

	const int coordX1 = (int)((-0.5f * (float)reference.getWidth()	/ 2.0f) + (float)reference.getWidth() / 2.0f);
	const int coordY1 = (int)((-0.5f * (float)reference.getHeight()	/ 2.0f) + (float)reference.getHeight() / 2.0f);
	const int coordX2 = (int)(( 0.5f * (float)reference.getWidth()	/ 2.0f) + (float)reference.getWidth() / 2.0f);
	const int coordY2 = (int)(( 0.5f * (float)reference.getHeight()	/ 2.0f) + (float)reference.getHeight() / 2.0f);

	for (int x = 0; x < reference.getWidth(); x++)
	{
		if (x < coordX1 || x > coordX2)
			continue;

		for (int y = 0; y < reference.getHeight(); y++)
		{
			if (y >= coordY1 && y <= coordY2)
				reference.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f), x, y);
		}
	}
}